

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-cdf-type.c
# Opt level: O2

coda_dynamic_type *
coda_cdf_variable_new
          (int32_t data_type,int32_t max_rec,int32_t rec_varys,int32_t num_dims,int32_t *dim,
          int32_t *dim_varys,coda_array_ordering array_ordering,int32_t num_elements,
          int sparse_rec_method,int has_compression,coda_cdf_variable **variable)

{
  int *piVar1;
  uint uVar2;
  byte bVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  coda_cdf_variable *type;
  ulong uVar8;
  int64_t *piVar9;
  coda_cdf_type *type_00;
  coda_cdf_time *pcVar10;
  coda_type_array *type_01;
  int iVar11;
  ulong uVar12;
  int32_t data_type_00;
  bool bVar13;
  int32_t local_4c;
  
  if (max_rec != 0 && rec_varys == 0) {
    __assert_fail("rec_varys || max_rec == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-cdf-type.c"
                  ,0x10c,
                  "coda_dynamic_type *coda_cdf_variable_new(int32_t, int32_t, int32_t, int32_t, int32_t *, int32_t *, coda_array_ordering, int32_t, int, int, coda_cdf_variable **)"
                 );
  }
  type = (coda_cdf_variable *)malloc(0x50);
  if (type == (coda_cdf_variable *)0x0) {
    coda_set_error(-1,"out of memory (could not allocate %lu bytes) (%s:%u)",0x50,
                   "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-cdf-type.c"
                   ,0x112);
    return (coda_dynamic_type *)0x0;
  }
  type->definition = (coda_type_array *)0x0;
  type->value_size = -1;
  bVar13 = false;
  type->backend = coda_backend_cdf;
  type->tag = tag_cdf_variable;
  type->attributes = (coda_mem_record *)0x0;
  type->base_type = (coda_cdf_type *)0x0;
  type->num_records = 1;
  type->num_values_per_record = 1;
  type->sparse_rec_method = sparse_rec_method;
  type->has_compression = has_compression;
  type->offset = (int64_t *)0x0;
  type->data = (int8_t *)0x0;
  if (rec_varys == 0) {
    uVar8 = 0;
    if (0 < num_dims) {
      uVar8 = (ulong)(uint)num_dims;
    }
    uVar12 = 0;
    do {
      bVar13 = uVar8 == uVar12;
      if (bVar13) break;
      piVar1 = dim_varys + uVar12;
      uVar12 = uVar12 + 1;
    } while (*piVar1 == 0);
  }
  if (data_type == 0x21) {
    data_type_00 = 8;
LAB_0017e65c:
    bVar3 = 1;
    bVar4 = false;
    local_4c = data_type;
  }
  else {
    if (data_type == 0x1f) {
      data_type_00 = 0x2d;
      goto LAB_0017e65c;
    }
    local_4c = -1;
    bVar4 = true;
    bVar3 = 0;
    data_type_00 = data_type;
  }
  if (bVar13) {
    iVar5 = basic_type_init((coda_cdf_type *)type,data_type_00,num_elements);
    if (iVar5 != 0) goto LAB_0017e758;
    type->value_size = (int)(type->definition->bit_size / 8);
LAB_0017e6a8:
    uVar2 = type->num_records;
    piVar9 = (int64_t *)malloc((long)(int)uVar2 * 8);
    type->offset = piVar9;
    if (piVar9 == (int64_t *)0x0) {
      coda_set_error(-1,"out of memory (could not allocate %lu bytes) (%s:%u)",(long)(int)uVar2 * 8,
                     "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-cdf-type.c"
                     ,0x189);
      coda_cdf_type_delete((coda_dynamic_type *)type);
      return (coda_dynamic_type *)0x0;
    }
    uVar12 = 0;
    uVar8 = (ulong)uVar2;
    if ((int)uVar2 < 1) {
      uVar8 = uVar12;
    }
    for (; uVar8 != uVar12; uVar12 = uVar12 + 1) {
      piVar9[uVar12] = -1;
    }
    *variable = type;
    if (!(bool)(bVar13 & bVar3)) {
      return (coda_dynamic_type *)type;
    }
    pcVar10 = time_type_new(local_4c,(coda_cdf_type *)type);
    if (pcVar10 != (coda_cdf_time *)0x0) {
      return (coda_dynamic_type *)pcVar10;
    }
  }
  else {
    type_00 = (coda_cdf_type *)malloc(0x18);
    if (type_00 == (coda_cdf_type *)0x0) {
      coda_set_error(-1,"out of memory (could not allocate %lu bytes) (%s:%u)",0x18,
                     "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-cdf-type.c"
                     ,0xbf);
    }
    else {
      type_00->backend = coda_backend_cdf;
      type_00->definition = (coda_type *)0x0;
      type_00->tag = tag_cdf_basic_type;
      iVar5 = basic_type_init(type_00,data_type_00,num_elements);
      if (iVar5 == 0) {
        type->base_type = type_00;
        if (!bVar4) {
          pcVar10 = time_type_new(local_4c,type_00);
          if (pcVar10 == (coda_cdf_time *)0x0) goto LAB_0017e758;
          type->base_type = (coda_cdf_type *)pcVar10;
        }
        type_01 = coda_type_array_new(coda_format_cdf);
        type->definition = type_01;
        if ((type_01 == (coda_type_array *)0x0) ||
           (iVar5 = coda_type_array_set_base_type(type_01,type->base_type->definition), iVar5 != 0))
        goto LAB_0017e758;
        if (rec_varys != 0) {
          iVar5 = coda_type_array_add_fixed_dimension(type->definition,(long)(max_rec + 1));
          if (iVar5 != 0) goto LAB_0017e758;
          type->num_records = max_rec + 1;
        }
        type->value_size = (int)(type->base_type->definition->bit_size / 8);
        iVar11 = 0;
        iVar5 = 0;
        if (0 < num_dims) {
          iVar5 = num_dims;
        }
        for (; num_dims = num_dims + -1, iVar5 != iVar11; iVar11 = iVar11 + 1) {
          iVar6 = num_dims;
          if (array_ordering == coda_array_ordering_c) {
            iVar6 = iVar11;
          }
          if (dim_varys[iVar6] != 0) {
            iVar7 = coda_type_array_add_fixed_dimension(type->definition,(long)dim[iVar6]);
            if (iVar7 != 0) goto LAB_0017e758;
            type->num_values_per_record = type->num_values_per_record * dim[iVar6];
          }
        }
        iVar5 = coda_type_array_validate(type->definition);
        if (iVar5 != 0) goto LAB_0017e758;
        goto LAB_0017e6a8;
      }
      coda_cdf_type_delete((coda_dynamic_type *)type_00);
    }
    type->base_type = (coda_cdf_type *)0x0;
  }
LAB_0017e758:
  coda_cdf_type_delete((coda_dynamic_type *)type);
  return (coda_dynamic_type *)0x0;
}

Assistant:

coda_dynamic_type *coda_cdf_variable_new(int32_t data_type, int32_t max_rec, int32_t rec_varys, int32_t num_dims,
                                         int32_t dim[CODA_MAX_NUM_DIMS], int32_t dim_varys[CODA_MAX_NUM_DIMS],
                                         coda_array_ordering array_ordering, int32_t num_elements,
                                         int sparse_rec_method, int has_compression, coda_cdf_variable **variable)
{
    coda_cdf_variable *type;
    int is_scalar = 0;
    int time_type = -1;
    int i;

    assert(rec_varys || max_rec == 0);

    type = (coda_cdf_variable *)malloc(sizeof(coda_cdf_variable));
    if (type == NULL)
    {
        coda_set_error(CODA_ERROR_OUT_OF_MEMORY, "out of memory (could not allocate %lu bytes) (%s:%u)",
                       (long)sizeof(coda_cdf_variable), __FILE__, __LINE__);
        return NULL;
    }
    type->backend = coda_backend_cdf;
    type->definition = NULL;
    type->tag = tag_cdf_variable;
    type->attributes = NULL;
    type->base_type = NULL;
    type->num_records = 1;
    type->num_values_per_record = 1;
    type->value_size = -1;
    type->sparse_rec_method = sparse_rec_method;
    type->has_compression = has_compression;
    type->offset = NULL;
    type->data = NULL;

    if (!rec_varys)
    {
        is_scalar = 1;
        for (i = 0; i < num_dims; i++)
        {
            if (dim_varys[i])
            {
                is_scalar = 0;
                break;
            }
        }
    }
    if (data_type == 31 || data_type == 33)
    {
        time_type = data_type;
        if (data_type == 31)
        {
            /* EPOCH */
            data_type = 45;
        }
        else
        {
            /* TIME_TT2000 */
            data_type = 8;
        }
    }

    if (is_scalar)
    {
        if (basic_type_init((coda_cdf_type *)type, data_type, num_elements) != 0)
        {
            coda_cdf_type_delete((coda_dynamic_type *)type);
            return NULL;
        }
        type->value_size = (int)(type->definition->bit_size / 8);
    }
    else
    {
        type->base_type = basic_type_new(data_type, num_elements);
        if (type->base_type == NULL)
        {
            coda_cdf_type_delete((coda_dynamic_type *)type);
            return NULL;
        }
        if (time_type != -1)
        {
            coda_cdf_time *base_type;

            base_type = time_type_new(time_type, type->base_type);
            if (base_type == NULL)
            {
                coda_cdf_type_delete((coda_dynamic_type *)type);
                return NULL;
            }
            type->base_type = (coda_cdf_type *)base_type;
        }
        type->definition = coda_type_array_new(coda_format_cdf);
        if (type->definition == NULL)
        {
            coda_cdf_type_delete((coda_dynamic_type *)type);
            return NULL;
        }
        if (coda_type_array_set_base_type(type->definition, type->base_type->definition) != 0)
        {
            coda_cdf_type_delete((coda_dynamic_type *)type);
            return NULL;
        }
        if (rec_varys)
        {
            if (coda_type_array_add_fixed_dimension(type->definition, max_rec + 1) != 0)
            {
                coda_cdf_type_delete((coda_dynamic_type *)type);
                return NULL;
            }
            type->num_records = max_rec + 1;
        }
        type->value_size = (int)(type->base_type->definition->bit_size / 8);
        for (i = 0; i < num_dims; i++)
        {
            /* make sure that we always add the dimensions using C array ordering */
            int dim_id = (array_ordering == coda_array_ordering_c ? i : num_dims - 1 - i);

            if (dim_varys[dim_id])
            {
                if (coda_type_array_add_fixed_dimension(type->definition, dim[dim_id]) != 0)
                {
                    coda_cdf_type_delete((coda_dynamic_type *)type);
                    return NULL;
                }
                type->num_values_per_record *= dim[dim_id];
            }
        }
        if (coda_type_array_validate(type->definition) != 0)
        {
            coda_cdf_type_delete((coda_dynamic_type *)type);
            return NULL;
        }
    }

    type->offset = malloc(type->num_records * sizeof(int64_t));
    if (type->offset == NULL)
    {
        coda_set_error(CODA_ERROR_OUT_OF_MEMORY, "out of memory (could not allocate %lu bytes) (%s:%u)",
                       type->num_records * sizeof(int64_t), __FILE__, __LINE__);
        coda_cdf_type_delete((coda_dynamic_type *)type);
        return NULL;
    }
    for (i = 0; i < type->num_records; i++)
    {
        type->offset[i] = -1;
    }

    *variable = type;

    if (is_scalar && time_type != -1)
    {
        coda_cdf_time *special_type;

        special_type = time_type_new(time_type, (coda_cdf_type *)type);
        if (special_type == NULL)
        {
            coda_cdf_type_delete((coda_dynamic_type *)type);
            return NULL;
        }
        return (coda_dynamic_type *)special_type;
    }

    return (coda_dynamic_type *)type;
}